

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1dc7c::
ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTScanTest_scanRangeReverseTwoLeaves_Test
          (ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeReverseTwoLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(2, unodb::test::test_values[1]);
  uint64_t n = 0;
  std::vector<std::pair<std::uint64_t, typename TypeParam::value_view>>
      visited{};
  auto fn = [&n,
             &visited](const unodb::visitor<typename TypeParam::iterator>& v) {
    n++;
    visited.emplace_back(decode(v.get_key()), v.get_value());
    return false;
  };
  db.scan_range(2, 0, fn);
  UNODB_EXPECT_EQ(2, n);
  UNODB_EXPECT_EQ(2, visited.size());
  UNODB_EXPECT_EQ(2, visited[0].first);  // make sure visited in reverse order.
  UNODB_EXPECT_EQ(1, visited[1].first);
}